

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this)

{
  Type args_1;
  undefined1 uVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Type local_40;
  Type local_3c;
  Type actual_1;
  Type actual;
  Type type;
  
  actual_1 = Any;
  local_3c = Any;
  RVar2 = PeekType(this,0,&local_3c);
  actual._3_1_ = (uint)(local_3c + I32) < 0xfffffffe;
  RVar3 = PeekType(this,1,&actual_1);
  args_1 = actual_1;
  local_40 = Any;
  RVar4 = PeekType(this,2,&local_40);
  uVar1 = (RVar4.enum_ == Error || (RVar3.enum_ == Error || RVar2.enum_ == Error)) | actual._3_1_ |
          ((local_40 != Any && args_1 != Any) && local_40 != args_1);
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,(Result)((byte)uVar1 & Error),"select",I32,args_1,args_1);
  RVar2 = DropTypes(this,3);
  PushType(this,args_1);
  return (Result)((byte)(uVar1 | RVar2.enum_ == Error) & Error);
}

Assistant:

Result TypeChecker::OnSelect() {
  Result result = Result::Ok;
  Type type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type);
  result |= PeekAndCheckType(2, type);
  PrintStackIfFailed(result, "select", Type::I32, type, type);
  result |= DropTypes(3);
  PushType(type);
  return result;
}